

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::presolveColSingletons(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  int iVar1;
  const_iterator __last;
  pointer puVar2;
  pointer piVar3;
  Result RVar4;
  const_iterator cVar5;
  const_iterator __first;
  long lVar6;
  size_t i;
  long lVar7;
  
  lVar7 = 0;
  while( true ) {
    cVar5._M_current =
         (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    lVar6 = (long)__last._M_current - (long)cVar5._M_current;
    if (lVar7 == lVar6 >> 2) break;
    if (((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start[cVar5._M_current[lVar7]] == '\0') &&
       (RVar4 = colPresolve(this,postsolve_stack,cVar5._M_current[lVar7]), RVar4 != kOk)) {
      return RVar4;
    }
    lVar7 = lVar7 + 1;
  }
  puVar2 = (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar3 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar7 = lVar6 >> 4; 0 < lVar7; lVar7 = lVar7 + -1) {
    if ((puVar2[*cVar5._M_current] != '\0') || (1 < piVar3[*cVar5._M_current])) goto LAB_0030bb8b;
    if ((puVar2[cVar5._M_current[1]] != '\0') || (1 < piVar3[cVar5._M_current[1]])) {
      cVar5._M_current = cVar5._M_current + 1;
      goto LAB_0030bb8b;
    }
    if ((puVar2[cVar5._M_current[2]] != '\0') || (1 < piVar3[cVar5._M_current[2]])) {
      cVar5._M_current = cVar5._M_current + 2;
      goto LAB_0030bb8b;
    }
    if ((puVar2[cVar5._M_current[3]] != '\0') || (1 < piVar3[cVar5._M_current[3]])) {
      cVar5._M_current = cVar5._M_current + 3;
      goto LAB_0030bb8b;
    }
    cVar5._M_current = cVar5._M_current + 4;
    lVar6 = lVar6 + -0x10;
  }
  lVar6 = lVar6 >> 2;
  if (lVar6 == 1) {
LAB_0030bc15:
    if ((puVar2[*cVar5._M_current] == '\0') && (piVar3[*cVar5._M_current] < 2)) {
      cVar5._M_current = __last._M_current;
    }
  }
  else if (lVar6 == 2) {
LAB_0030bbfe:
    if ((puVar2[*cVar5._M_current] == '\0') && (piVar3[*cVar5._M_current] < 2)) {
      cVar5._M_current = cVar5._M_current + 1;
      goto LAB_0030bc15;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (lVar6 != 3) goto LAB_0030bbbc;
    if ((puVar2[*cVar5._M_current] == '\0') && (piVar3[*cVar5._M_current] < 2)) {
      cVar5._M_current = cVar5._M_current + 1;
      goto LAB_0030bbfe;
    }
  }
LAB_0030bb8b:
  __first._M_current = cVar5._M_current;
  if (cVar5._M_current != __last._M_current) {
    while (cVar5._M_current = cVar5._M_current + 1, cVar5._M_current != __last._M_current) {
      iVar1 = *cVar5._M_current;
      if ((puVar2[iVar1] == '\0') && (piVar3[iVar1] < 2)) {
        *__first._M_current = iVar1;
        __first._M_current = __first._M_current + 1;
      }
    }
  }
LAB_0030bbbc:
  std::vector<int,_std::allocator<int>_>::erase(&this->singletonColumns,__first,__last);
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::presolveColSingletons(
    HighsPostsolveStack& postsolve_stack) {
  for (size_t i = 0; i != singletonColumns.size(); ++i) {
    HighsInt col = singletonColumns[i];
    if (colDeleted[col]) continue;
    HPRESOLVE_CHECKED_CALL(colPresolve(postsolve_stack, col));
  }
  singletonColumns.erase(
      std::remove_if(
          singletonColumns.begin(), singletonColumns.end(),
          [&](HighsInt col) { return colDeleted[col] || colsize[col] > 1; }),
      singletonColumns.end());

  return Result::kOk;
}